

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityMarking *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EntityMarking *local_18;
  EntityMarking *this_local;
  
  local_18 = this;
  this_local = (EntityMarking *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Entity Marking:");
  poVar1 = std::operator<<(poVar1,"\n\tMaring Char Set:      ");
  ENUMS::GetEnumAsStringEntityMarkingCharacterSet_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui8EntityMarkingCharacterSet,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tMarking String:       ");
  GetEntityMarkingString_abi_cxx11_(&local_1f0,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityMarking::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Marking:"
       << "\n\tMaring Char Set:      " << GetEnumAsStringEntityMarkingCharacterSet( m_ui8EntityMarkingCharacterSet )
       << "\n\tMarking String:       " << GetEntityMarkingString()
       << "\n";

    return ss.str();
}